

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString __thiscall
ON_SubDToBrepParameters::VertexProcessToString
          (ON_SubDToBrepParameters *this,VertexProcess vertex_process)

{
  wchar_t *local_20;
  wchar_t *s;
  VertexProcess vertex_process_local;
  
  switch(vertex_process) {
  case None:
    local_20 = L"None";
    break;
  case LocalG1:
    local_20 = L"G1";
    break;
  case LocalG2:
    local_20 = L"G2";
    break;
  case LocalG1x:
    local_20 = L"G1x";
    break;
  case LocalG1xx:
    local_20 = L"G1xx";
    break;
  default:
    local_20 = L"INVALID";
  }
  ON_wString::ON_wString((ON_wString *)this,local_20);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDToBrepParameters::VertexProcessToString(
  ON_SubDToBrepParameters::VertexProcess vertex_process
)
{
  const wchar_t* s;
  switch (vertex_process)
  {
  case ON_SubDToBrepParameters::VertexProcess::None:
    s = L"None";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG1:
    s = L"G1";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG2:
    s = L"G2";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG1x:
    s = L"G1x";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG1xx:
    s = L"G1xx";
    break;
  default:
    s = L"INVALID";
    break;
  }
  return ON_wString(s);
}